

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::reduce_number_length(string *unit_string,char detect)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  size_type __n;
  ulong uVar6;
  size_t length;
  ulong uVar7;
  char *__s;
  ulong uVar8;
  ulong uVar9;
  string *psVar10;
  bool bVar11;
  
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar4 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar4 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  psVar10 = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  if (detect == '0') {
    psVar10 = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  __s = (psVar10->_M_dataplus)._M_p;
  __n = psVar10->_M_string_length;
  uVar7 = 0;
  do {
    uVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 __s,uVar7,__n);
    if (uVar5 == 0xffffffffffffffff) {
      return;
    }
    uVar7 = uVar5 + 5;
    uVar8 = unit_string->_M_string_length;
    uVar6 = 0xffffffffffffffff;
    if (uVar7 < uVar8) {
      uVar9 = uVar7;
      do {
        uVar6 = uVar9;
        if ((unit_string->_M_dataplus)._M_p[uVar9] != detect) break;
        uVar9 = uVar9 + 1;
        uVar6 = 0xffffffffffffffff;
      } while (uVar8 != uVar9);
    }
    if (uVar6 == 0xffffffffffffffff) {
      if (detect != '9') {
        if (uVar8 == 0) {
LAB_0040508c:
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar7 = uVar5 + 1;
          if (uVar8 - 1 <= uVar5) {
            uVar7 = uVar8;
          }
          do {
            uVar6 = uVar7 - 1;
            if (uVar7 == 0) goto LAB_0040508c;
            lVar3 = uVar7 - 1;
            uVar7 = uVar6;
          } while ((unit_string->_M_dataplus)._M_p[lVar3] != '.');
        }
        uVar7 = uVar8;
        if (uVar6 != 0xffffffffffffffff) {
          uVar8 = uVar5 - 1;
          pcVar2 = (unit_string->_M_dataplus)._M_p;
          if (uVar6 == uVar8) {
            do {
              do {
                uVar9 = uVar6;
                uVar6 = 0;
              } while (uVar9 == 0);
              cVar1 = pcVar2[uVar9 - 1];
              bVar11 = (byte)(cVar1 - 0x30U) < 10;
              uVar5 = uVar8;
              if (!bVar11) goto LAB_004050fc;
              uVar6 = uVar9 - 1;
            } while (cVar1 == '0');
            bVar11 = true;
          }
          else {
            do {
              uVar6 = uVar6 + 1;
              bVar11 = uVar5 <= uVar6;
              if (bVar11) goto LAB_004050fc;
            } while ((byte)(pcVar2[uVar6] - 0x30U) < 10);
            bVar11 = false;
          }
LAB_004050fc:
          if (bVar11) {
            length = ~uVar5;
            goto LAB_0040514b;
          }
        }
      }
    }
    else {
      uVar7 = uVar6 + 1;
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      if ((pcVar2[uVar6] != '.') &&
         ((9 < (byte)(pcVar2[uVar6] - 0x30U) ||
          ((uVar7 < uVar8 && (uVar6 = uVar7, 9 < (byte)(pcVar2[uVar7] - 0x30U))))))) {
        if (uVar8 == 0) {
LAB_0040502d:
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar9 = uVar5 + 1;
          if (uVar8 - 1 <= uVar5) {
            uVar9 = uVar8;
          }
          do {
            uVar8 = uVar9 - 1;
            if (uVar9 == 0) goto LAB_0040502d;
            lVar3 = uVar9 - 1;
            uVar9 = uVar8;
          } while (pcVar2[lVar3] != '.');
        }
        if ((uVar8 != 0xffffffffffffffff) && (0xc < uVar6 - uVar8)) {
          uVar9 = uVar5 - 1;
          if (uVar8 == uVar9) {
            do {
              uVar5 = uVar9;
              if ((uVar8 == 0) || (lVar3 = uVar8 - 1, 9 < (byte)(pcVar2[lVar3] - 0x30U))) {
                bVar11 = false;
                goto LAB_0040513a;
              }
              uVar8 = uVar8 - 1;
            } while (pcVar2[lVar3] == '0');
            bVar11 = true;
          }
          else {
            do {
              uVar8 = uVar8 + 1;
              bVar11 = uVar5 <= uVar8;
              if (bVar11) goto LAB_0040513a;
            } while ((byte)(pcVar2[uVar8] - 0x30U) < 10);
            bVar11 = false;
          }
LAB_0040513a:
          if (bVar11) {
            length = uVar6 - uVar5;
LAB_0040514b:
            shorten_number(unit_string,uVar5,length);
            uVar7 = uVar5 + 1;
          }
        }
      }
    }
    __s = (psVar10->_M_dataplus)._M_p;
    __n = psVar10->_M_string_length;
  } while( true );
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}